

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O0

void __thiscall OrderGrid::paintEvent(OrderGrid *this,QPaintEvent *evt)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int x;
  int w;
  int iVar6;
  Order *this_00;
  OrderRow *pOVar7;
  const_iterator pvVar8;
  int y;
  value_type_conflict2 id;
  const_iterator __end2;
  const_iterator __begin2;
  OrderRow *__range2;
  int xpos_1;
  OrderRow row;
  int i_1;
  int ypos;
  int i;
  int gap;
  int xpos;
  int trackerPos;
  int cursorYpos;
  bool _hasFocus;
  Order *order;
  int cursorPattern;
  int cellHeight;
  QPainter local_20 [4];
  int cellWidth;
  QPainter painter;
  QPaintEvent *evt_local;
  OrderGrid *this_local;
  
  _painter = evt;
  QPainter::QPainter(local_20,(QPaintDevice *)&this->field_0x10);
  iVar3 = CellPainter::cellWidth(&this->mCellPainter);
  iVar4 = CellPainter::cellHeight(&this->mCellPainter);
  iVar5 = PatternModel::cursorPattern(this->mModel);
  this_00 = PatternModel::order(this->mModel);
  bVar1 = QWidget::hasFocus();
  y = (iVar5 - this->mPatternStart) * iVar4;
  bVar2 = PatternModel::isPlaying(this->mModel);
  if ((bVar2) &&
     ((iVar6 = PatternModel::trackerCursorPattern(this->mModel), iVar6 != iVar5 ||
      ((bVar1 & 1) == 0)))) {
    x = QRect::x(&this->mGridRect);
    iVar5 = this->mPatternStart;
    w = QRect::width(&this->mGridRect);
    QPainter::fillRect(local_20,x,(iVar6 - iVar5) * iVar4,w,iVar4,&this->mTrackerColor);
  }
  if ((bVar1 & 1) != 0) {
    iVar5 = QRect::x(&this->mGridRect);
    iVar6 = QRect::width(&this->mGridRect);
    QPainter::fillRect(local_20,iVar5,y,iVar6,iVar4,&this->mRowColor);
  }
  if ((this->mChangeAll & 1U) == 0) {
    iVar5 = cursorX(this);
    QPainter::fillRect(local_20,iVar5,y,iVar3,iVar4,&this->mCursorColor);
  }
  else {
    iVar5 = QRect::x(&this->mGridRect);
    i = iVar5 + iVar3;
    if ((this->mHighNibble & 1U) == 0) {
      i = iVar3 + i;
    }
    for (i_1 = 0; i_1 < 4; i_1 = i_1 + 1) {
      QPainter::fillRect(local_20,i,y,iVar3,iVar4,&this->mCursorColor);
      i = iVar3 * 3 + i;
    }
  }
  row._M_elems[0] = '\0';
  row._M_elems[1] = '\0';
  row._M_elems[2] = '\0';
  row._M_elems[3] = '\0';
  for (xpos_1 = this->mPatternStart; xpos_1 < this->mPatternEnd; xpos_1 = xpos_1 + 1) {
    CachedPen::get(&this->mPen,&this->mRownoColor);
    QPainter::setPen((QPen *)local_20);
    CellPainter::drawHex(&this->mCellPainter,local_20,xpos_1,4,(int)row._M_elems);
    CachedPen::get(&this->mPen,&this->mTextColor);
    QPainter::setPen((QPen *)local_20);
    pOVar7 = trackerboy::Order::operator[](this_00,xpos_1);
    __range2._4_4_ = *(undefined4 *)pOVar7->_M_elems;
    __range2._0_4_ = QRect::x(&this->mGridRect);
    __end2 = std::array<unsigned_char,_4UL>::begin
                       ((array<unsigned_char,_4UL> *)((long)&__range2 + 4));
    pvVar8 = std::array<unsigned_char,_4UL>::end((array<unsigned_char,_4UL> *)((long)&__range2 + 4))
    ;
    for (; __end2 != pvVar8; __end2 = __end2 + 1) {
      __range2._0_4_ = (int)__range2 + iVar3;
      __range2._0_4_ =
           CellPainter::drawHex
                     (&this->mCellPainter,local_20,(uint)*__end2,(int)__range2,(int)row._M_elems);
    }
    row._M_elems = iVar4 + row._M_elems;
  }
  iVar3 = QRect::x(&this->mGridRect);
  iVar4 = QRect::height(&this->mGridRect);
  QPainter::fillRect(local_20,iVar3 + -1,0,1,iVar4,&this->mLineColor);
  QPainter::~QPainter(local_20);
  return;
}

Assistant:

void OrderGrid::paintEvent(QPaintEvent *evt) {
    Q_UNUSED(evt)

    QPainter painter(this);

    auto const cellWidth = mCellPainter.cellWidth();
    auto const cellHeight = mCellPainter.cellHeight();
    auto const cursorPattern = mModel.cursorPattern();
    auto const& order = mModel.order();
    auto const _hasFocus = hasFocus();

    int cursorYpos = (cursorPattern - mPatternStart) * cellHeight;

    if (mModel.isPlaying()) {
        auto trackerPos = mModel.trackerCursorPattern();
        // draw the tracker position except when the editor has focus and
        // the tracker position is equal to the cursor
        if (trackerPos != cursorPattern || !_hasFocus) {
            painter.fillRect(
                mGridRect.x(),
                (trackerPos - mPatternStart) * cellHeight,
                mGridRect.width(),
                cellHeight,
                mTrackerColor
            );
        }
    }

    // cursor row background
    if (_hasFocus) {
        painter.fillRect(mGridRect.x(), cursorYpos, mGridRect.width(), cellHeight, mRowColor);
    }

    // cursor
    if (mChangeAll) {
        int xpos = mGridRect.x() + cellWidth;
        if (!mHighNibble) {
            xpos += cellWidth;
        }
        int gap = cellWidth * 3;
        for (int i = 0; i < 4; ++i) {
            painter.fillRect(xpos, cursorYpos, cellWidth, cellHeight, mCursorColor);
            xpos += gap;
        }
    
    } else {
        painter.fillRect(cursorX(), cursorYpos, cellWidth, cellHeight, mCursorColor);
    }

    int ypos = 0;
    for (int i = mPatternStart; i < mPatternEnd; ++i) {
        painter.setPen(mPen.get(mRownoColor));
        // rowno
        mCellPainter.drawHex(painter, i, SPACING, ypos);

        // order data
        painter.setPen(mPen.get(mTextColor));
        auto const row = order[i];
        int xpos = mGridRect.x();
        for (auto id : row) {
            xpos += cellWidth;
            xpos = mCellPainter.drawHex(painter, id, xpos, ypos);
        }

        ypos += cellHeight;
    }


    // line
    painter.fillRect(mGridRect.x() - LINE_WIDTH, 0, LINE_WIDTH, mGridRect.height(), mLineColor);
}